

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

string * __thiscall
slang::CommandLine::Option::set
          (Option *this,OptionCallback *target,string_view param_3,string_view value)

{
  basic_string_view<char,_std::char_traits<char>_> __args;
  string_view value_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> entry;
  iterator __end1;
  iterator __begin1;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
  *__range1;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> splitMem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result;
  string *this_00;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  *this_01;
  size_type *psVar2;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *splitMem_00;
  undefined8 in_stack_ffffffffffffff00;
  undefined1 allowCommaList;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  uint uVar3;
  __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
  local_a8 [3];
  bitmask<slang::CommandLineFlags> local_8c;
  pointer local_88;
  size_t sStack_80;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> local_78
  ;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
  *local_68;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> local_60;
  
  allowCommaList = (undefined1)((ulong)in_stack_ffffffffffffff00 >> 0x38);
  this_01 = (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
             *)&stack0x00000008;
  splitMem_00 = &local_60;
  this_00 = in_RDI;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL>::SmallVector
            ((SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *)0x2ff637);
  local_88 = *(pointer *)&(this_01->super__Function_base)._M_functor;
  sStack_80 = ((__extent_storage<18446744073709551615UL> *)
              ((long)&(this_01->super__Function_base)._M_functor + 8))->_M_extent_value;
  psVar2 = &in_RSI[4]._M_string_length;
  bitmask<slang::CommandLineFlags>::bitmask(&local_8c,CommaList);
  bitmask<slang::CommandLineFlags>::has
            ((bitmask<slang::CommandLineFlags> *)this_00,(bitmask<slang::CommandLineFlags> *)in_RDI)
  ;
  value_00._M_str._0_4_ = in_stack_ffffffffffffff10;
  value_00._M_len = in_stack_ffffffffffffff08;
  value_00._M_str._4_4_ = in_stack_ffffffffffffff14;
  local_78 = parseList(value_00,(bool)allowCommaList,splitMem_00);
  local_68 = &local_78;
  local_a8[0]._M_current =
       (basic_string_view<char,_std::char_traits<char>_> *)
       std::
       span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>::
       begin((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
              *)in_RDI);
  std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>::
  end((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> *)
      this_01);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                      ((__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                        *)this_00,
                       (__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
    ::operator*(local_a8);
    __args._M_str = (char *)psVar2;
    __args._M_len = (size_t)in_RSI;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
    ::operator()(this_01,__args);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2ff764
                      );
    uVar3 = (uint)!bVar1;
    if (bVar1) {
      std::__cxx11::string::~string(this_00);
    }
    if (uVar3 != 0) goto LAB_002ff7e1;
    __gnu_cxx::
    __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
    ::operator++(local_a8);
  }
  std::__cxx11::string::string(in_RSI);
LAB_002ff7e1:
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL>::~SmallVector
            ((SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *)0x2ff7ee);
  return this_00;
}

Assistant:

std::string CommandLine::Option::set(OptionCallback& target, std::string_view,
                                     std::string_view value) {
    SmallVector<std::string_view> splitMem;
    for (auto entry : parseList(value, flags.has(CommandLineFlags::CommaList), splitMem)) {
        auto result = target(entry);
        if (!result.empty())
            return result;
    }
    return {};
}